

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O0

void sunCreateLogMessage(SUNLogLevel lvl,int rank,char *scope,char *label,char *txt,
                        __va_list_tag *args,char **log_msg)

{
  int iVar1;
  char *__ptr;
  void *pvVar2;
  __va_list_tag *in_RCX;
  char *in_RDX;
  uint in_ESI;
  int in_EDI;
  undefined8 *in_stack_00000008;
  char *fileAndLine;
  int msg_length;
  char *formatted_txt;
  char *prefix;
  char *in_stack_ffffffffffffffb8;
  char *local_30;
  
  local_30 = (char *)0x0;
  *in_stack_00000008 = 0;
  iVar1 = sunvasnprintf((char **)CONCAT44(in_EDI,in_ESI),in_RDX,in_RCX);
  if (iVar1 < 0) {
    __ptr = sunCombineFileAndLine(iVar1,in_stack_ffffffffffffffb8);
    fprintf(_stderr,"[ERROR][rank %d][%s][%s] %s\n",(ulong)in_ESI,__ptr,"sunCreateLogMessage",
            "FATAL LOGGER ERROR: message size too large");
    free(__ptr);
  }
  if (in_EDI == 4) {
    local_30 = "DEBUG";
  }
  else if (in_EDI == 2) {
    local_30 = "WARNING";
  }
  else if (in_EDI == 3) {
    local_30 = "INFO";
  }
  else if (in_EDI == 1) {
    local_30 = "ERROR";
  }
  iVar1 = snprintf((char *)0x0,0,"[%s][rank %d][%s][%s] %s\n",local_30,(ulong)in_ESI,in_RDX,in_RCX,0
                  );
  pvVar2 = malloc((long)(iVar1 + 1));
  *in_stack_00000008 = pvVar2;
  snprintf((char *)*in_stack_00000008,(long)(iVar1 + 1),"[%s][rank %d][%s][%s] %s\n",local_30,
           (ulong)in_ESI,in_RDX,in_RCX,0);
  free((void *)0x0);
  return;
}

Assistant:

void sunCreateLogMessage(SUNLogLevel lvl, int rank, const char* scope,
                         const char* label, const char* txt, va_list args,
                         char** log_msg)
{
  const char* prefix;
  char* formatted_txt;
  int msg_length;

  prefix        = NULL;
  formatted_txt = NULL;
  msg_length    = 0;
  *log_msg      = NULL;

  msg_length = sunvasnprintf(&formatted_txt, txt, args);
  if (msg_length < 0)
  {
    char* fileAndLine = sunCombineFileAndLine(__LINE__ + 1, __FILE__);
    fprintf(stderr, "[ERROR][rank %d][%s][%s] %s\n", rank, fileAndLine,
            __func__, "FATAL LOGGER ERROR: message size too large");
    free(fileAndLine);
  }

  if (lvl == SUN_LOGLEVEL_DEBUG) { prefix = "DEBUG"; }
  else if (lvl == SUN_LOGLEVEL_WARNING) { prefix = "WARNING"; }
  else if (lvl == SUN_LOGLEVEL_INFO) { prefix = "INFO"; }
  else if (lvl == SUN_LOGLEVEL_ERROR) { prefix = "ERROR"; }

  msg_length = snprintf(NULL, 0, "[%s][rank %d][%s][%s] %s\n", prefix, rank,
                        scope, label, formatted_txt);
  *log_msg   = (char*)malloc(msg_length + 1);
  snprintf(*log_msg, msg_length + 1, "[%s][rank %d][%s][%s] %s\n", prefix, rank,
           scope, label, formatted_txt);
  free(formatted_txt);
}